

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O3

void duckdb::InitializeUpdateData<duckdb::interval_t>
               (UpdateInfo *base_info,Vector *base_data,UpdateInfo *update_info,
               UnifiedVectorFormat *update,SelectionVector *sel)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  data_ptr_t pdVar4;
  sel_t *psVar5;
  unsigned_long *puVar6;
  undefined8 uVar7;
  undefined8 *puVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  
  uVar1 = update_info->N;
  if ((ulong)uVar1 != 0) {
    pdVar4 = update->data;
    puVar8 = (undefined8 *)((long)&update_info[1].segment + (ulong)update_info->max * 4);
    uVar10 = 0;
    do {
      uVar11 = uVar10;
      if (sel->sel_vector != (sel_t *)0x0) {
        uVar11 = (ulong)sel->sel_vector[uVar10];
      }
      psVar5 = update->sel->sel_vector;
      if (psVar5 != (sel_t *)0x0) {
        uVar11 = (ulong)psVar5[uVar11];
      }
      uVar7 = *(undefined8 *)(pdVar4 + uVar11 * 0x10 + 8);
      *puVar8 = *(undefined8 *)(pdVar4 + uVar11 * 0x10);
      puVar8[1] = uVar7;
      uVar10 = uVar10 + 1;
      puVar8 = puVar8 + 2;
    } while (uVar1 != uVar10);
  }
  pdVar4 = base_data->data;
  FlatVector::VerifyFlatVector(base_data);
  uVar1 = base_info->N;
  if ((ulong)uVar1 != 0) {
    uVar2 = base_info->max;
    lVar9 = 0;
    do {
      uVar3 = *(uint *)((long)&base_info[1].segment + lVar9);
      puVar6 = (base_data->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar6 == (unsigned_long *)0x0) ||
         ((puVar6[uVar3 >> 6] >> ((ulong)uVar3 & 0x3f) & 1) != 0)) {
        uVar7 = *(undefined8 *)(pdVar4 + (ulong)uVar3 * 0x10 + 8);
        puVar8 = (undefined8 *)((long)&base_info[1].segment + lVar9 * 4 + (ulong)uVar2 * 4);
        *puVar8 = *(undefined8 *)(pdVar4 + (ulong)uVar3 * 0x10);
        puVar8[1] = uVar7;
      }
      lVar9 = lVar9 + 4;
    } while ((ulong)uVar1 << 2 != lVar9);
  }
  return;
}

Assistant:

static void InitializeUpdateData(UpdateInfo &base_info, Vector &base_data, UpdateInfo &update_info,
                                 UnifiedVectorFormat &update, const SelectionVector &sel) {
	auto update_data = update.GetData<T>(update);
	auto tuple_data = update_info.GetData<T>();

	for (idx_t i = 0; i < update_info.N; i++) {
		auto idx = update.sel->get_index(sel.get_index(i));
		tuple_data[i] = update_data[idx];
	}

	auto base_array_data = FlatVector::GetData<T>(base_data);
	auto &base_validity = FlatVector::Validity(base_data);
	auto base_tuple_data = base_info.GetData<T>();
	auto base_tuples = base_info.GetTuples();
	for (idx_t i = 0; i < base_info.N; i++) {
		auto base_idx = base_tuples[i];
		if (!base_validity.RowIsValid(base_idx)) {
			continue;
		}
		base_tuple_data[i] = UpdateSelectElement::Operation<T>(*base_info.segment, base_array_data[base_idx]);
	}
}